

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Flatten_x86_fma::forward(Flatten_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  int iVar24;
  undefined8 *puVar25;
  long in_RCX;
  long *in_RDX;
  long *in_RSI;
  Flatten *in_RDI;
  bool bVar26;
  __m256 _v;
  int i_4;
  float *outptr;
  float *ptr_4;
  int q_2;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 _row3_3;
  __m128 _row2_3;
  __m128 _row1_3;
  __m128 _row0_3;
  int i_3;
  float *outptr3_3;
  float *outptr2_3;
  float *outptr1_3;
  float *outptr0_3;
  float *ptr_3;
  int q_1;
  __m256 _row7_1;
  __m256 _row6_1;
  __m256 _row5_1;
  __m256 _row4_1;
  __m256 _row3_2;
  __m256 _row2_2;
  __m256 _row1_2;
  __m256 _row0_2;
  int i_2;
  float *outptr7_1;
  float *outptr6_1;
  float *outptr5_1;
  float *outptr4_1;
  float *outptr3_2;
  float *outptr2_2;
  float *outptr1_2;
  float *outptr0_2;
  float *ptr_2;
  int q;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _row3_1;
  __m128 _row2_1;
  __m128 _row1_1;
  __m128 _row0_1;
  int j_1;
  float *outptr3_1;
  float *outptr2_1;
  float *outptr1_1;
  float *outptr0_1;
  float *ptr_1;
  int i_1;
  __m256 _row7;
  __m256 _row6;
  __m256 _row5;
  __m256 _row4;
  __m256 _row3;
  __m256 _row2;
  __m256 _row1;
  __m256 _row0;
  int j;
  float *outptr7;
  float *outptr6;
  float *outptr5;
  float *outptr4;
  float *outptr3;
  float *outptr2;
  float *outptr1;
  float *outptr0;
  float *ptr;
  int i;
  size_t out_elemsize;
  int out_elempack;
  int total;
  int size;
  int elempack;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  int dims;
  int elembits;
  __m256 _tmpf_1;
  __m256 _tmpe_1;
  __m256 _tmpd_1;
  __m256 _tmpc_1;
  __m256 _tmpb_1;
  __m256 _tmpa_1;
  __m256 _tmp9_1;
  __m256 _tmp8_1;
  __m256 _tmp7_1;
  __m256 _tmp6_1;
  __m256 _tmp5_1;
  __m256 _tmp4_1;
  __m256 _tmp3_1;
  __m256 _tmp2_1;
  __m256 _tmp1_1;
  __m256 _tmp0_1;
  __m256 _tmpf;
  __m256 _tmpe;
  __m256 _tmpd;
  __m256 _tmpc;
  __m256 _tmpb;
  __m256 _tmpa;
  __m256 _tmp9;
  __m256 _tmp8;
  __m256 _tmp7;
  __m256 _tmp6;
  __m256 _tmp5;
  __m256 _tmp4;
  __m256 _tmp3;
  __m256 _tmp2;
  __m256 _tmp1;
  __m256 _tmp0;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_ffffffffffffe4d8;
  undefined8 in_stack_ffffffffffffe4e0;
  size_t in_stack_ffffffffffffe4e8;
  undefined8 in_stack_ffffffffffffe4f0;
  Mat *in_stack_ffffffffffffe4f8;
  int local_1a8c;
  Option *in_stack_ffffffffffffe578;
  Mat *in_stack_ffffffffffffe580;
  long *plVar27;
  undefined4 in_stack_ffffffffffffe588;
  int iVar28;
  int local_1a24;
  undefined1 (*local_1a20) [32];
  undefined1 (*local_19d0) [32];
  int local_19c4;
  undefined8 local_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 local_1950;
  undefined8 uStack_1948;
  int local_193c;
  undefined1 (*local_1938) [16];
  undefined8 *local_1930;
  undefined8 *local_1928;
  Option *in_stack_ffffffffffffe6e0;
  Mat *in_stack_ffffffffffffe6e8;
  Mat *in_stack_ffffffffffffe6f0;
  Flatten_x86_fma *in_stack_ffffffffffffe6f8;
  undefined1 (*local_18d0) [16];
  int local_18c4;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  int local_17ac;
  undefined1 (*local_17a8) [32];
  undefined8 *local_17a0;
  undefined8 *local_1798;
  undefined8 *local_1790;
  undefined8 *local_1788;
  undefined8 *local_1780;
  undefined8 *local_1778;
  undefined8 *local_1770;
  undefined1 (*local_1710) [32];
  int local_1704;
  undefined8 local_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 local_1690;
  undefined8 uStack_1688;
  int local_1674;
  undefined1 (*local_1670) [16];
  undefined8 *local_1668;
  undefined8 *local_1660;
  undefined8 *local_1658;
  undefined1 (*local_1650) [16];
  int local_1644;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  int local_1534;
  undefined1 (*local_1530) [32];
  undefined8 *local_1528;
  undefined8 *local_1520;
  undefined8 *local_1518;
  undefined8 *local_1510;
  undefined8 *local_1508;
  undefined8 *local_1500;
  undefined8 *local_14f8;
  undefined1 (*local_14f0) [32];
  int local_14e4;
  int local_14d8;
  int local_1484;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  
  if ((int)in_RSI[3] == 0) {
    iVar28 = 0;
  }
  else {
    iVar28 = (int)((long)((ulong)(uint)((int)(in_RSI[2] << 3) >> 0x1f) << 0x20 |
                         in_RSI[2] << 3 & 0xffffffffU) / (long)(int)in_RSI[3]);
  }
  if (iVar28 == 8) {
    local_1484 = forward_int8(in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f0,
                              in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0);
  }
  else {
    iVar1 = (int)in_RSI[5];
    if (iVar1 == 1) {
      if (in_RDX != in_RSI) {
        if (in_RSI[1] != 0) {
          LOCK();
          *(int *)in_RSI[1] = *(int *)in_RSI[1] + 1;
          UNLOCK();
        }
        plVar27 = in_RDX;
        if (in_RDX[1] != 0) {
          piVar6 = (int *)in_RDX[1];
          LOCK();
          iVar28 = *piVar6;
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (iVar28 == 1) {
            if (in_RDX[4] == 0) {
              if ((void *)*in_RDX != (void *)0x0) {
                free((void *)*in_RDX);
              }
            }
            else {
              (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
            }
          }
        }
        *in_RDX = 0;
        in_RDX[2] = 0;
        *(undefined4 *)(in_RDX + 3) = 0;
        *(undefined4 *)(in_RDX + 5) = 0;
        *(undefined4 *)((long)in_RDX + 0x2c) = 0;
        *(undefined4 *)(in_RDX + 6) = 0;
        *(undefined4 *)((long)in_RDX + 0x34) = 0;
        *(undefined4 *)(in_RDX + 7) = 0;
        in_RDX[8] = 0;
        in_RDX[1] = 0;
        *plVar27 = *in_RSI;
        plVar27[1] = in_RSI[1];
        plVar27[2] = in_RSI[2];
        *(int *)(plVar27 + 3) = (int)in_RSI[3];
        plVar27[4] = in_RSI[4];
        *(int *)(plVar27 + 5) = (int)in_RSI[5];
        *(undefined4 *)((long)plVar27 + 0x2c) = *(undefined4 *)((long)in_RSI + 0x2c);
        *(int *)(plVar27 + 6) = (int)in_RSI[6];
        *(undefined4 *)((long)plVar27 + 0x34) = *(undefined4 *)((long)in_RSI + 0x34);
        *(int *)(plVar27 + 7) = (int)in_RSI[7];
        plVar27[8] = in_RSI[8];
      }
      local_1484 = 0;
    }
    else {
      iVar2 = *(int *)((long)in_RSI + 0x2c);
      iVar3 = (int)in_RSI[6];
      iVar4 = (int)in_RSI[7];
      uVar7 = in_RSI[2];
      iVar5 = (int)in_RSI[3];
      iVar23 = iVar2 * iVar3 * *(int *)((long)in_RSI + 0x34);
      iVar24 = iVar23 * iVar4 * iVar5;
      local_14d8 = 1;
      if ((*(byte *)(in_RCX + 0x27) & 1) != 0) {
        if (iVar24 % 8 == 0) {
          local_1a8c = 8;
        }
        else {
          local_1a8c = 1;
          if (iVar24 % 4 == 0) {
            local_1a8c = 4;
          }
        }
        local_14d8 = local_1a8c;
      }
      if (local_14d8 == 1) {
        local_1484 = Flatten::forward(in_RDI,(Mat *)CONCAT44(iVar28,in_stack_ffffffffffffe588),
                                      in_stack_ffffffffffffe580,in_stack_ffffffffffffe578);
      }
      else if ((iVar1 == 2) && (iVar5 == 1)) {
        if (in_RDX != in_RSI) {
          if (in_RSI[1] != 0) {
            LOCK();
            *(int *)in_RSI[1] = *(int *)in_RSI[1] + 1;
            UNLOCK();
          }
          if (in_RDX[1] != 0) {
            piVar6 = (int *)in_RDX[1];
            LOCK();
            iVar28 = *piVar6;
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (iVar28 == 1) {
              if (in_RDX[4] == 0) {
                if ((void *)*in_RDX != (void *)0x0) {
                  free((void *)*in_RDX);
                }
              }
              else {
                (**(code **)(*(long *)in_RDX[4] + 0x18))
                          ((long *)in_RDX[4],*in_RDX,uVar7 % (ulong)(long)iVar5);
              }
            }
          }
          *in_RDX = 0;
          in_RDX[2] = 0;
          *(undefined4 *)(in_RDX + 3) = 0;
          *(undefined4 *)(in_RDX + 5) = 0;
          *(undefined4 *)((long)in_RDX + 0x2c) = 0;
          *(undefined4 *)(in_RDX + 6) = 0;
          *(undefined4 *)((long)in_RDX + 0x34) = 0;
          *(undefined4 *)(in_RDX + 7) = 0;
          in_RDX[8] = 0;
          in_RDX[1] = 0;
          *in_RDX = *in_RSI;
          in_RDX[1] = in_RSI[1];
          in_RDX[2] = in_RSI[2];
          *(int *)(in_RDX + 3) = (int)in_RSI[3];
          in_RDX[4] = in_RSI[4];
          *(int *)(in_RDX + 5) = (int)in_RSI[5];
          *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)in_RSI + 0x2c);
          *(int *)(in_RDX + 6) = (int)in_RSI[6];
          *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)in_RSI + 0x34);
          *(int *)(in_RDX + 7) = (int)in_RSI[7];
          in_RDX[8] = in_RSI[8];
        }
        *(undefined4 *)(in_RDX + 5) = 1;
        *(int *)((long)in_RDX + 0x2c) = iVar24 / local_14d8;
        *(undefined4 *)(in_RDX + 6) = 1;
        in_RDX[8] = (long)*(int *)((long)in_RDX + 0x2c);
        in_RDX[2] = (uVar7 / (ulong)(long)iVar5) * (long)local_14d8;
        *(int *)(in_RDX + 3) = local_14d8;
        local_1484 = 0;
      }
      else {
        Mat::create(in_stack_ffffffffffffe4f8,(int)((ulong)in_stack_ffffffffffffe4f0 >> 0x20),
                    in_stack_ffffffffffffe4e8,(int)((ulong)in_stack_ffffffffffffe4e0 >> 0x20),
                    in_stack_ffffffffffffe4d8);
        bVar26 = true;
        if (*in_RDX != 0) {
          bVar26 = in_RDX[8] * (long)(int)in_RDX[7] == 0;
        }
        if (bVar26) {
          local_1484 = -100;
        }
        else {
          if (iVar1 == 2) {
            if (iVar5 == 8) {
              for (local_14e4 = 0; local_14e4 < iVar3; local_14e4 = local_14e4 + 1) {
                local_14f0 = (undefined1 (*) [32])
                             (*in_RSI +
                             (long)*(int *)((long)in_RSI + 0x2c) * (long)local_14e4 * in_RSI[2]);
                local_14f8 = (undefined8 *)(*in_RDX + (long)(iVar2 * local_14e4 * 8) * 4);
                local_1500 = (undefined8 *)(*in_RDX + (long)(iVar2 * (local_14e4 * 8 + 1)) * 4);
                local_1508 = (undefined8 *)(*in_RDX + (long)(iVar2 * (local_14e4 * 8 + 2)) * 4);
                local_1510 = (undefined8 *)(*in_RDX + (long)(iVar2 * (local_14e4 * 8 + 3)) * 4);
                local_1518 = (undefined8 *)(*in_RDX + (long)(iVar2 * (local_14e4 * 8 + 4)) * 4);
                local_1520 = (undefined8 *)(*in_RDX + (long)(iVar2 * (local_14e4 * 8 + 5)) * 4);
                local_1528 = (undefined8 *)(*in_RDX + (long)(iVar2 * (local_14e4 * 8 + 6)) * 4);
                local_1530 = (undefined1 (*) [32])
                             (*in_RDX + (long)(iVar2 * (local_14e4 * 8 + 7)) * 4);
                for (local_1534 = 0; local_1534 + 7 < iVar2; local_1534 = local_1534 + 8) {
                  auVar19 = vunpcklps_avx(*local_14f0,local_14f0[1]);
                  auVar10 = vunpckhps_avx(*local_14f0,local_14f0[1]);
                  auVar20 = vunpcklps_avx(local_14f0[2],local_14f0[3]);
                  auVar11 = vunpckhps_avx(local_14f0[2],local_14f0[3]);
                  auVar21 = vunpcklps_avx(local_14f0[4],local_14f0[5]);
                  auVar12 = vunpckhps_avx(local_14f0[4],local_14f0[5]);
                  auVar22 = vunpcklps_avx(local_14f0[6],local_14f0[7]);
                  auVar13 = vunpckhps_avx(local_14f0[6],local_14f0[7]);
                  auVar15 = vunpcklpd_avx(auVar19,auVar20);
                  auVar19 = vunpckhpd_avx(auVar19,auVar20);
                  auVar20 = vunpcklpd_avx(auVar10,auVar11);
                  auVar10 = vunpckhpd_avx(auVar10,auVar11);
                  auVar16 = vunpcklpd_avx(auVar21,auVar22);
                  auVar11 = vunpckhpd_avx(auVar21,auVar22);
                  auVar21 = vunpcklpd_avx(auVar12,auVar13);
                  auVar12 = vunpckhpd_avx(auVar12,auVar13);
                  local_fa0 = auVar15._0_8_;
                  uStack_f98 = auVar15._8_8_;
                  local_1020 = auVar16._0_8_;
                  uStack_1018 = auVar16._8_8_;
                  local_fc0 = auVar19._0_8_;
                  uStack_fb8 = auVar19._8_8_;
                  local_1040 = auVar11._0_8_;
                  uStack_1038 = auVar11._8_8_;
                  local_fe0 = auVar20._0_8_;
                  uStack_fd8 = auVar20._8_8_;
                  local_1060 = auVar21._0_8_;
                  uStack_1058 = auVar21._8_8_;
                  local_1000 = auVar10._0_8_;
                  uStack_ff8 = auVar10._8_8_;
                  local_1080 = auVar12._0_8_;
                  uStack_1078 = auVar12._8_8_;
                  auVar13 = vperm2f128_avx(auVar15,auVar16,0x31);
                  uStack_15c8 = auVar13._24_8_;
                  uStack_15d0 = auVar13._16_8_;
                  uStack_15d8 = auVar13._8_8_;
                  local_15e0 = auVar13._0_8_;
                  auVar19 = vperm2f128_avx(auVar19,auVar11,0x31);
                  uStack_15e8 = auVar19._24_8_;
                  uStack_15f0 = auVar19._16_8_;
                  uStack_15f8 = auVar19._8_8_;
                  local_1600 = auVar19._0_8_;
                  auVar19 = vperm2f128_avx(auVar20,auVar21,0x31);
                  uStack_1608 = auVar19._24_8_;
                  uStack_1610 = auVar19._16_8_;
                  uStack_1618 = auVar19._8_8_;
                  local_1620 = auVar19._0_8_;
                  auVar19 = vperm2f128_avx(auVar10,auVar12,0x31);
                  *local_14f8 = local_fa0;
                  local_14f8[1] = uStack_f98;
                  local_14f8[2] = local_1020;
                  local_14f8[3] = uStack_1018;
                  *local_1500 = local_fc0;
                  local_1500[1] = uStack_fb8;
                  local_1500[2] = local_1040;
                  local_1500[3] = uStack_1038;
                  *local_1508 = local_fe0;
                  local_1508[1] = uStack_fd8;
                  local_1508[2] = local_1060;
                  local_1508[3] = uStack_1058;
                  *local_1510 = local_1000;
                  local_1510[1] = uStack_ff8;
                  local_1510[2] = local_1080;
                  local_1510[3] = uStack_1078;
                  *local_1518 = local_15e0;
                  local_1518[1] = uStack_15d8;
                  local_1518[2] = uStack_15d0;
                  local_1518[3] = uStack_15c8;
                  *local_1520 = local_1600;
                  local_1520[1] = uStack_15f8;
                  local_1520[2] = uStack_15f0;
                  local_1520[3] = uStack_15e8;
                  *local_1528 = local_1620;
                  local_1528[1] = uStack_1618;
                  local_1528[2] = uStack_1610;
                  local_1528[3] = uStack_1608;
                  *local_1530 = auVar19;
                  local_14f8 = local_14f8 + 4;
                  local_1500 = local_1500 + 4;
                  local_1508 = local_1508 + 4;
                  local_1510 = local_1510 + 4;
                  local_1518 = local_1518 + 4;
                  local_1520 = local_1520 + 4;
                  local_1528 = local_1528 + 4;
                  local_1530 = local_1530 + 1;
                  local_14f0 = local_14f0 + 8;
                }
                for (; local_1534 < iVar2; local_1534 = local_1534 + 1) {
                  *(undefined4 *)local_14f8 = *(undefined4 *)*local_14f0;
                  *(undefined4 *)local_1500 = *(undefined4 *)(*local_14f0 + 4);
                  *(undefined4 *)local_1508 = *(undefined4 *)(*local_14f0 + 8);
                  *(undefined4 *)local_1510 = *(undefined4 *)(*local_14f0 + 0xc);
                  *(undefined4 *)local_1518 = *(undefined4 *)(*local_14f0 + 0x10);
                  *(undefined4 *)local_1520 = *(undefined4 *)(*local_14f0 + 0x14);
                  *(undefined4 *)local_1528 = *(undefined4 *)(*local_14f0 + 0x18);
                  *(undefined4 *)*local_1530 = *(undefined4 *)(*local_14f0 + 0x1c);
                  local_14f0 = local_14f0 + 1;
                  local_1530 = (undefined1 (*) [32])(*local_1530 + 4);
                  local_1528 = (undefined8 *)((long)local_1528 + 4);
                  local_1520 = (undefined8 *)((long)local_1520 + 4);
                  local_1518 = (undefined8 *)((long)local_1518 + 4);
                  local_1510 = (undefined8 *)((long)local_1510 + 4);
                  local_1508 = (undefined8 *)((long)local_1508 + 4);
                  local_1500 = (undefined8 *)((long)local_1500 + 4);
                  local_14f8 = (undefined8 *)((long)local_14f8 + 4);
                }
              }
            }
            if (iVar5 == 4) {
              for (local_1644 = 0; local_1644 < iVar3; local_1644 = local_1644 + 1) {
                local_1650 = (undefined1 (*) [16])
                             (*in_RSI +
                             (long)*(int *)((long)in_RSI + 0x2c) * (long)local_1644 * in_RSI[2]);
                local_1658 = (undefined8 *)(*in_RDX + (long)(iVar2 * local_1644 * 4) * 4);
                local_1660 = (undefined8 *)(*in_RDX + (long)(iVar2 * (local_1644 * 4 + 1)) * 4);
                local_1668 = (undefined8 *)(*in_RDX + (long)(iVar2 * (local_1644 * 4 + 2)) * 4);
                local_1670 = (undefined1 (*) [16])
                             (*in_RDX + (long)(iVar2 * (local_1644 * 4 + 3)) * 4);
                for (local_1674 = 0; local_1674 + 3 < iVar2; local_1674 = local_1674 + 4) {
                  auVar17 = vunpcklps_avx(*local_1650,local_1650[1]);
                  auVar18 = vunpcklps_avx(local_1650[2],local_1650[3]);
                  auVar8 = vunpckhps_avx(*local_1650,local_1650[1]);
                  auVar9 = vunpckhps_avx(local_1650[2],local_1650[3]);
                  auVar14 = vunpcklpd_avx(auVar17,auVar18);
                  auVar17 = vunpckhpd_avx(auVar17,auVar18);
                  auVar18 = vunpcklpd_avx(auVar8,auVar9);
                  auVar8 = vunpckhpd_avx(auVar8,auVar9);
                  local_1690 = auVar14._0_8_;
                  uStack_1688 = auVar14._8_8_;
                  *local_1658 = local_1690;
                  local_1658[1] = uStack_1688;
                  local_16a0 = auVar17._0_8_;
                  uStack_1698 = auVar17._8_8_;
                  *local_1660 = local_16a0;
                  local_1660[1] = uStack_1698;
                  local_16b0 = auVar18._0_8_;
                  uStack_16a8 = auVar18._8_8_;
                  *local_1668 = local_16b0;
                  local_1668[1] = uStack_16a8;
                  *local_1670 = auVar8;
                  local_1650 = local_1650 + 4;
                  local_1658 = local_1658 + 2;
                  local_1660 = local_1660 + 2;
                  local_1668 = local_1668 + 2;
                  local_1670 = local_1670 + 1;
                }
                for (; local_1674 < iVar2; local_1674 = local_1674 + 1) {
                  *(undefined4 *)local_1658 = *(undefined4 *)*local_1650;
                  *(undefined4 *)local_1660 = *(undefined4 *)(*local_1650 + 4);
                  *(undefined4 *)local_1668 = *(undefined4 *)(*local_1650 + 8);
                  *(undefined4 *)*local_1670 = *(undefined4 *)(*local_1650 + 0xc);
                  local_1650 = local_1650 + 1;
                  local_1670 = (undefined1 (*) [16])(*local_1670 + 4);
                  local_1668 = (undefined8 *)((long)local_1668 + 4);
                  local_1660 = (undefined8 *)((long)local_1660 + 4);
                  local_1658 = (undefined8 *)((long)local_1658 + 4);
                }
              }
            }
          }
          if ((iVar1 == 3) || (iVar1 == 4)) {
            if (iVar5 == 8) {
              for (local_1704 = 0; local_1704 < iVar4; local_1704 = local_1704 + 1) {
                local_1710 = (undefined1 (*) [32])
                             (*in_RSI + in_RSI[8] * (long)local_1704 * in_RSI[2]);
                local_1770 = (undefined8 *)(*in_RDX + (long)(iVar23 * local_1704 * 8) * 4);
                local_1778 = (undefined8 *)(*in_RDX + (long)(iVar23 * (local_1704 * 8 + 1)) * 4);
                local_1780 = (undefined8 *)(*in_RDX + (long)(iVar23 * (local_1704 * 8 + 2)) * 4);
                local_1788 = (undefined8 *)(*in_RDX + (long)(iVar23 * (local_1704 * 8 + 3)) * 4);
                local_1790 = (undefined8 *)(*in_RDX + (long)(iVar23 * (local_1704 * 8 + 4)) * 4);
                local_1798 = (undefined8 *)(*in_RDX + (long)(iVar23 * (local_1704 * 8 + 5)) * 4);
                local_17a0 = (undefined8 *)(*in_RDX + (long)(iVar23 * (local_1704 * 8 + 6)) * 4);
                local_17a8 = (undefined1 (*) [32])
                             (*in_RDX + (long)(iVar23 * (local_1704 * 8 + 7)) * 4);
                for (local_17ac = 0; local_17ac + 7 < iVar23; local_17ac = local_17ac + 8) {
                  auVar19 = vunpcklps_avx(*local_1710,local_1710[1]);
                  auVar10 = vunpckhps_avx(*local_1710,local_1710[1]);
                  auVar20 = vunpcklps_avx(local_1710[2],local_1710[3]);
                  auVar11 = vunpckhps_avx(local_1710[2],local_1710[3]);
                  auVar21 = vunpcklps_avx(local_1710[4],local_1710[5]);
                  auVar12 = vunpckhps_avx(local_1710[4],local_1710[5]);
                  auVar22 = vunpcklps_avx(local_1710[6],local_1710[7]);
                  auVar13 = vunpckhps_avx(local_1710[6],local_1710[7]);
                  auVar15 = vunpcklpd_avx(auVar19,auVar20);
                  auVar19 = vunpckhpd_avx(auVar19,auVar20);
                  auVar20 = vunpcklpd_avx(auVar10,auVar11);
                  auVar10 = vunpckhpd_avx(auVar10,auVar11);
                  auVar16 = vunpcklpd_avx(auVar21,auVar22);
                  auVar11 = vunpckhpd_avx(auVar21,auVar22);
                  auVar21 = vunpcklpd_avx(auVar12,auVar13);
                  auVar12 = vunpckhpd_avx(auVar12,auVar13);
                  local_11e0 = auVar15._0_8_;
                  uStack_11d8 = auVar15._8_8_;
                  local_1260 = auVar16._0_8_;
                  uStack_1258 = auVar16._8_8_;
                  local_1200 = auVar19._0_8_;
                  uStack_11f8 = auVar19._8_8_;
                  local_1280 = auVar11._0_8_;
                  uStack_1278 = auVar11._8_8_;
                  local_1220 = auVar20._0_8_;
                  uStack_1218 = auVar20._8_8_;
                  local_12a0 = auVar21._0_8_;
                  uStack_1298 = auVar21._8_8_;
                  local_1240 = auVar10._0_8_;
                  uStack_1238 = auVar10._8_8_;
                  local_12c0 = auVar12._0_8_;
                  uStack_12b8 = auVar12._8_8_;
                  auVar13 = vperm2f128_avx(auVar15,auVar16,0x31);
                  uStack_1848 = auVar13._24_8_;
                  uStack_1850 = auVar13._16_8_;
                  uStack_1858 = auVar13._8_8_;
                  local_1860 = auVar13._0_8_;
                  auVar19 = vperm2f128_avx(auVar19,auVar11,0x31);
                  uStack_1868 = auVar19._24_8_;
                  uStack_1870 = auVar19._16_8_;
                  uStack_1878 = auVar19._8_8_;
                  local_1880 = auVar19._0_8_;
                  auVar19 = vperm2f128_avx(auVar20,auVar21,0x31);
                  uStack_1888 = auVar19._24_8_;
                  uStack_1890 = auVar19._16_8_;
                  uStack_1898 = auVar19._8_8_;
                  local_18a0 = auVar19._0_8_;
                  auVar19 = vperm2f128_avx(auVar10,auVar12,0x31);
                  *local_1770 = local_11e0;
                  local_1770[1] = uStack_11d8;
                  local_1770[2] = local_1260;
                  local_1770[3] = uStack_1258;
                  *local_1778 = local_1200;
                  local_1778[1] = uStack_11f8;
                  local_1778[2] = local_1280;
                  local_1778[3] = uStack_1278;
                  *local_1780 = local_1220;
                  local_1780[1] = uStack_1218;
                  local_1780[2] = local_12a0;
                  local_1780[3] = uStack_1298;
                  *local_1788 = local_1240;
                  local_1788[1] = uStack_1238;
                  local_1788[2] = local_12c0;
                  local_1788[3] = uStack_12b8;
                  *local_1790 = local_1860;
                  local_1790[1] = uStack_1858;
                  local_1790[2] = uStack_1850;
                  local_1790[3] = uStack_1848;
                  *local_1798 = local_1880;
                  local_1798[1] = uStack_1878;
                  local_1798[2] = uStack_1870;
                  local_1798[3] = uStack_1868;
                  *local_17a0 = local_18a0;
                  local_17a0[1] = uStack_1898;
                  local_17a0[2] = uStack_1890;
                  local_17a0[3] = uStack_1888;
                  *local_17a8 = auVar19;
                  local_1770 = local_1770 + 4;
                  local_1778 = local_1778 + 4;
                  local_1780 = local_1780 + 4;
                  local_1788 = local_1788 + 4;
                  local_1790 = local_1790 + 4;
                  local_1798 = local_1798 + 4;
                  local_17a0 = local_17a0 + 4;
                  local_17a8 = local_17a8 + 1;
                  local_1710 = local_1710 + 8;
                }
                for (; local_17ac < iVar23; local_17ac = local_17ac + 1) {
                  *(undefined4 *)local_1770 = *(undefined4 *)*local_1710;
                  *(undefined4 *)local_1778 = *(undefined4 *)(*local_1710 + 4);
                  *(undefined4 *)local_1780 = *(undefined4 *)(*local_1710 + 8);
                  *(undefined4 *)local_1788 = *(undefined4 *)(*local_1710 + 0xc);
                  *(undefined4 *)local_1790 = *(undefined4 *)(*local_1710 + 0x10);
                  *(undefined4 *)local_1798 = *(undefined4 *)(*local_1710 + 0x14);
                  *(undefined4 *)local_17a0 = *(undefined4 *)(*local_1710 + 0x18);
                  *(undefined4 *)*local_17a8 = *(undefined4 *)(*local_1710 + 0x1c);
                  local_1710 = local_1710 + 1;
                  local_17a8 = (undefined1 (*) [32])(*local_17a8 + 4);
                  local_17a0 = (undefined8 *)((long)local_17a0 + 4);
                  local_1798 = (undefined8 *)((long)local_1798 + 4);
                  local_1790 = (undefined8 *)((long)local_1790 + 4);
                  local_1788 = (undefined8 *)((long)local_1788 + 4);
                  local_1780 = (undefined8 *)((long)local_1780 + 4);
                  local_1778 = (undefined8 *)((long)local_1778 + 4);
                  local_1770 = (undefined8 *)((long)local_1770 + 4);
                }
              }
            }
            if (iVar5 == 4) {
              for (local_18c4 = 0; local_18c4 < iVar4; local_18c4 = local_18c4 + 1) {
                local_18d0 = (undefined1 (*) [16])
                             (*in_RSI + in_RSI[8] * (long)local_18c4 * in_RSI[2]);
                puVar25 = (undefined8 *)(*in_RDX + (long)(iVar23 * local_18c4 * 4) * 4);
                local_1928 = (undefined8 *)(*in_RDX + (long)(iVar23 * (local_18c4 * 4 + 1)) * 4);
                local_1930 = (undefined8 *)(*in_RDX + (long)(iVar23 * (local_18c4 * 4 + 2)) * 4);
                local_1938 = (undefined1 (*) [16])
                             (*in_RDX + (long)(iVar23 * (local_18c4 * 4 + 3)) * 4);
                for (local_193c = 0; local_193c + 3 < iVar23; local_193c = local_193c + 4) {
                  auVar17 = vunpcklps_avx(*local_18d0,local_18d0[1]);
                  auVar18 = vunpcklps_avx(local_18d0[2],local_18d0[3]);
                  auVar8 = vunpckhps_avx(*local_18d0,local_18d0[1]);
                  auVar9 = vunpckhps_avx(local_18d0[2],local_18d0[3]);
                  auVar14 = vunpcklpd_avx(auVar17,auVar18);
                  auVar17 = vunpckhpd_avx(auVar17,auVar18);
                  auVar18 = vunpcklpd_avx(auVar8,auVar9);
                  auVar8 = vunpckhpd_avx(auVar8,auVar9);
                  local_1950 = auVar14._0_8_;
                  uStack_1948 = auVar14._8_8_;
                  *puVar25 = local_1950;
                  puVar25[1] = uStack_1948;
                  local_1960 = auVar17._0_8_;
                  uStack_1958 = auVar17._8_8_;
                  *local_1928 = local_1960;
                  local_1928[1] = uStack_1958;
                  local_1970 = auVar18._0_8_;
                  uStack_1968 = auVar18._8_8_;
                  *local_1930 = local_1970;
                  local_1930[1] = uStack_1968;
                  *local_1938 = auVar8;
                  local_18d0 = local_18d0 + 4;
                  puVar25 = puVar25 + 2;
                  local_1928 = local_1928 + 2;
                  local_1930 = local_1930 + 2;
                  local_1938 = local_1938 + 1;
                }
                for (; local_193c < iVar23; local_193c = local_193c + 1) {
                  *(undefined4 *)puVar25 = *(undefined4 *)*local_18d0;
                  *(undefined4 *)local_1928 = *(undefined4 *)(*local_18d0 + 4);
                  *(undefined4 *)local_1930 = *(undefined4 *)(*local_18d0 + 8);
                  *(undefined4 *)*local_1938 = *(undefined4 *)(*local_18d0 + 0xc);
                  local_18d0 = local_18d0 + 1;
                  local_1938 = (undefined1 (*) [16])(*local_1938 + 4);
                  local_1930 = (undefined8 *)((long)local_1930 + 4);
                  local_1928 = (undefined8 *)((long)local_1928 + 4);
                  puVar25 = (undefined8 *)((long)puVar25 + 4);
                }
              }
            }
            if (iVar5 == 1) {
              for (local_19c4 = 0; local_19c4 < iVar4; local_19c4 = local_19c4 + 1) {
                local_19d0 = (undefined1 (*) [32])
                             (*in_RSI + in_RSI[8] * (long)local_19c4 * in_RSI[2]);
                local_1a20 = (undefined1 (*) [32])(*in_RDX + (long)(iVar23 * local_19c4) * 4);
                for (local_1a24 = 0; local_1a24 + 7 < iVar23; local_1a24 = local_1a24 + 8) {
                  *local_1a20 = *local_19d0;
                  local_19d0 = local_19d0 + 1;
                  local_1a20 = local_1a20 + 1;
                }
                for (; local_1a24 < iVar23; local_1a24 = local_1a24 + 1) {
                  *(undefined4 *)*local_1a20 = *(undefined4 *)*local_19d0;
                  local_1a20 = (undefined1 (*) [32])(*local_1a20 + 4);
                  local_19d0 = (undefined1 (*) [32])(*local_19d0 + 4);
                }
              }
            }
          }
          local_1484 = 0;
        }
      }
    }
  }
  return local_1484;
}

Assistant:

int Flatten_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = total % 16 == 0 ? 16 : total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#else
        out_elempack = total % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16) // out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 16;
                float* outptr1 = (float*)top_blob + w * (i * 16 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 16 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 16 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 16 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 16 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 16 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 16 + 7);
                float* outptr8 = (float*)top_blob + w * (i * 16 + 8);
                float* outptr9 = (float*)top_blob + w * (i * 16 + 9);
                float* outptra = (float*)top_blob + w * (i * 16 + 10);
                float* outptrb = (float*)top_blob + w * (i * 16 + 11);
                float* outptrc = (float*)top_blob + w * (i * 16 + 12);
                float* outptrd = (float*)top_blob + w * (i * 16 + 13);
                float* outptre = (float*)top_blob + w * (i * 16 + 14);
                float* outptrf = (float*)top_blob + w * (i * 16 + 15);

                int j = 0;
                for (; j + 15 < w; j += 16)
                {
                    __m512 _r0 = _mm512_loadu_ps(ptr);
                    __m512 _r1 = _mm512_loadu_ps(ptr + 16);
                    __m512 _r2 = _mm512_loadu_ps(ptr + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(ptr + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(ptr + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(ptr + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(ptr + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(ptr + 16 * 7);
                    __m512 _r8 = _mm512_loadu_ps(ptr + 16 * 8);
                    __m512 _r9 = _mm512_loadu_ps(ptr + 16 * 9);
                    __m512 _ra = _mm512_loadu_ps(ptr + 16 * 10);
                    __m512 _rb = _mm512_loadu_ps(ptr + 16 * 11);
                    __m512 _rc = _mm512_loadu_ps(ptr + 16 * 12);
                    __m512 _rd = _mm512_loadu_ps(ptr + 16 * 13);
                    __m512 _re = _mm512_loadu_ps(ptr + 16 * 14);
                    __m512 _rf = _mm512_loadu_ps(ptr + 16 * 15);

                    transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                    _mm512_storeu_ps(outptr0, _r0);
                    _mm512_storeu_ps(outptr1, _r1);
                    _mm512_storeu_ps(outptr2, _r2);
                    _mm512_storeu_ps(outptr3, _r3);
                    _mm512_storeu_ps(outptr4, _r4);
                    _mm512_storeu_ps(outptr5, _r5);
                    _mm512_storeu_ps(outptr6, _r6);
                    _mm512_storeu_ps(outptr7, _r7);
                    _mm512_storeu_ps(outptr8, _r8);
                    _mm512_storeu_ps(outptr9, _r9);
                    _mm512_storeu_ps(outptra, _ra);
                    _mm512_storeu_ps(outptrb, _rb);
                    _mm512_storeu_ps(outptrc, _rc);
                    _mm512_storeu_ps(outptrd, _rd);
                    _mm512_storeu_ps(outptre, _re);
                    _mm512_storeu_ps(outptrf, _rf);

                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                    outptr4 += 16;
                    outptr5 += 16;
                    outptr6 += 16;
                    outptr7 += 16;
                    outptr8 += 16;
                    outptr9 += 16;
                    outptra += 16;
                    outptrb += 16;
                    outptrc += 16;
                    outptrd += 16;
                    outptre += 16;
                    outptrf += 16;
                    ptr += 256;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];
                    *outptr8++ = ptr[8];
                    *outptr9++ = ptr[9];
                    *outptra++ = ptr[10];
                    *outptrb++ = ptr[11];
                    *outptrc++ = ptr[12];
                    *outptrd++ = ptr[13];
                    *outptre++ = ptr[14];
                    *outptrf++ = ptr[15];

                    ptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8) // out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 8;
                float* outptr1 = (float*)top_blob + w * (i * 8 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 8 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 8 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 8 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 8 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 8 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j + 7 < w; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 4;
                float* outptr1 = (float*)top_blob + w * (i * 4 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 4 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 4 + 3);

                int j = 0;
                for (; j + 3 < w; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (dims == 3 || dims == 4)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16) // out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 16;
                float* outptr1 = (float*)top_blob + size * (q * 16 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 16 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 16 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 16 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 16 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 16 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 16 + 7);
                float* outptr8 = (float*)top_blob + size * (q * 16 + 8);
                float* outptr9 = (float*)top_blob + size * (q * 16 + 9);
                float* outptra = (float*)top_blob + size * (q * 16 + 10);
                float* outptrb = (float*)top_blob + size * (q * 16 + 11);
                float* outptrc = (float*)top_blob + size * (q * 16 + 12);
                float* outptrd = (float*)top_blob + size * (q * 16 + 13);
                float* outptre = (float*)top_blob + size * (q * 16 + 14);
                float* outptrf = (float*)top_blob + size * (q * 16 + 15);

                int i = 0;
                for (; i + 15 < size; i += 16)
                {
                    __m512 _r0 = _mm512_loadu_ps(ptr);
                    __m512 _r1 = _mm512_loadu_ps(ptr + 16);
                    __m512 _r2 = _mm512_loadu_ps(ptr + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(ptr + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(ptr + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(ptr + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(ptr + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(ptr + 16 * 7);
                    __m512 _r8 = _mm512_loadu_ps(ptr + 16 * 8);
                    __m512 _r9 = _mm512_loadu_ps(ptr + 16 * 9);
                    __m512 _ra = _mm512_loadu_ps(ptr + 16 * 10);
                    __m512 _rb = _mm512_loadu_ps(ptr + 16 * 11);
                    __m512 _rc = _mm512_loadu_ps(ptr + 16 * 12);
                    __m512 _rd = _mm512_loadu_ps(ptr + 16 * 13);
                    __m512 _re = _mm512_loadu_ps(ptr + 16 * 14);
                    __m512 _rf = _mm512_loadu_ps(ptr + 16 * 15);

                    transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                    _mm512_storeu_ps(outptr0, _r0);
                    _mm512_storeu_ps(outptr1, _r1);
                    _mm512_storeu_ps(outptr2, _r2);
                    _mm512_storeu_ps(outptr3, _r3);
                    _mm512_storeu_ps(outptr4, _r4);
                    _mm512_storeu_ps(outptr5, _r5);
                    _mm512_storeu_ps(outptr6, _r6);
                    _mm512_storeu_ps(outptr7, _r7);
                    _mm512_storeu_ps(outptr8, _r8);
                    _mm512_storeu_ps(outptr9, _r9);
                    _mm512_storeu_ps(outptra, _ra);
                    _mm512_storeu_ps(outptrb, _rb);
                    _mm512_storeu_ps(outptrc, _rc);
                    _mm512_storeu_ps(outptrd, _rd);
                    _mm512_storeu_ps(outptre, _re);
                    _mm512_storeu_ps(outptrf, _rf);

                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                    outptr4 += 16;
                    outptr5 += 16;
                    outptr6 += 16;
                    outptr7 += 16;
                    outptr8 += 16;
                    outptr9 += 16;
                    outptra += 16;
                    outptrb += 16;
                    outptrc += 16;
                    outptrd += 16;
                    outptre += 16;
                    outptrf += 16;
                    ptr += 256;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];
                    *outptr8++ = ptr[8];
                    *outptr9++ = ptr[9];
                    *outptra++ = ptr[10];
                    *outptrb++ = ptr[11];
                    *outptrc++ = ptr[12];
                    *outptrd++ = ptr[13];
                    *outptre++ = ptr[14];
                    *outptrf++ = ptr[15];

                    ptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8) // out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 8;
                float* outptr1 = (float*)top_blob + size * (q * 8 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 8 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 8 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 8 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 8 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 8 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 4;
                float* outptr1 = (float*)top_blob + size * (q * 4 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 4 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 4 + 3);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = (float*)top_blob + size * q;

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}